

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

void __thiscall
QCommandLineParserPrivate::showHelp
          (QCommandLineParserPrivate *this,int exitCode,bool includeQtOptions)

{
  int unaff_retaddr;
  QString *in_stack_00000008;
  MessageType in_stack_00000014;
  bool in_stack_00000087;
  QCommandLineParserPrivate *in_stack_00000088;
  
  helpText(in_stack_00000088,in_stack_00000087);
  QCommandLineParser::showMessageAndExit(in_stack_00000014,in_stack_00000008,unaff_retaddr);
}

Assistant:

Q_NORETURN void QCommandLineParserPrivate::showHelp(int exitCode, bool includeQtOptions)
{
    QCommandLineParser::showMessageAndExit(QCommandLineParser::MessageType::Information,
                                           helpText(includeQtOptions),
                                           exitCode);
}